

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  allocator<char> local_189;
  string local_188;
  Move<vk::Handle<(vk::HandleType)18>_> local_158;
  RefData<vk::Handle<(vk::HandleType)18>_> local_138;
  undefined1 local_118 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj;
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,1);
  this_00 = &obj.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  ComputePipeline::Resources::Resources
            ((Resources *)this_00,this,(Parameters *)((long)&context_local + 7));
  ComputePipeline::create
            (&local_158,this,(Resources *)this_00,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data.object.m_internal = local_138.object.m_internal;
  data.deleter.m_device = local_138.deleter.m_device;
  data.deleter.m_allocator = local_138.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_118,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_158);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Ok",&local_189);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  ComputePipeline::Resources::~Resources
            ((Resources *)
             &obj.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}